

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

bool __thiscall
OpenMD::SelectionEvaluator::loadScript(SelectionEvaluator *this,string *filename,string *script)

{
  pointer pvVar1;
  bool bVar2;
  bool bVar3;
  SelectionEvaluator *this_00;
  pointer tokens;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::clear(&(this->variables)._M_t);
  std::__cxx11::string::_M_assign((string *)&this->filename);
  std::__cxx11::string::_M_assign((string *)&this->script);
  bVar2 = SelectionCompiler::compile(&this->compiler,filename,script);
  if (bVar2) {
    this->pc = 0;
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::vector((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
              *)&stack0xffffffffffffffc0,&(this->compiler).aatokenCompiled);
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::_M_move_assign(&this->aatoken,
                     (vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                      *)&stack0xffffffffffffffc0);
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::~vector((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
               *)&stack0xffffffffffffffc0);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc0,
               &(this->compiler).lineNumbers);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&this->linenumbers,
               (_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffffc0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffffc0);
    this_00 = (SelectionEvaluator *)&stack0xffffffffffffffc0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this_00,&(this->compiler).lineIndices);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->lineIndices,this_00);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)this_00);
    this->isDynamic_ = false;
    tokens = (this->aatoken).
             super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (this->aatoken).
             super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (tokens == pvVar1) goto LAB_00220eed;
      bVar3 = containDynamicToken(this_00,tokens);
      tokens = tokens + 1;
    } while (!bVar3);
    this->isDynamic_ = true;
LAB_00220eed:
    this->isLoaded_ = true;
  }
  else {
    this->error = true;
    SelectionCompiler::getErrorMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffffc0,&this->compiler);
    std::__cxx11::string::operator=
              ((string *)&this->errorMessage,(string *)&stack0xffffffffffffffc0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    snprintf(painCave.errMsg,2000,"SelectionCompiler Error: %s\n",
             (this->errorMessage)._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  return bVar2;
}

Assistant:

bool SelectionEvaluator::loadScript(const std::string& filename,
                                      const std::string& script) {
    clearDefinitionsAndLoadPredefined();
    this->filename = filename;
    this->script   = script;
    if (!compiler.compile(filename, script)) {
      error        = true;
      errorMessage = compiler.getErrorMessage();

      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SelectionCompiler Error: %s\n", errorMessage.c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
      return false;
    }

    pc          = 0;
    aatoken     = compiler.getAatokenCompiled();
    linenumbers = compiler.getLineNumbers();
    lineIndices = compiler.getLineIndices();

    std::vector<std::vector<Token>>::const_iterator i;

    isDynamic_ = false;
    for (i = aatoken.begin(); i != aatoken.end(); ++i) {
      if (containDynamicToken(*i)) {
        isDynamic_ = true;
        break;
      }
    }

    isLoaded_ = true;
    return true;
  }